

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PopulationDirector.cpp
# Opt level: O0

shared_ptr<Population> __thiscall
PopulationDirector::makeAverage(PopulationDirector *this,string *name)

{
  TypeName TVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *this_00;
  RandomGenerator *pRVar4;
  Config *pCVar5;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Population> sVar6;
  shared_ptr<Population> local_b8;
  undefined1 local_a1;
  pair<int,_int> local_a0;
  pair<int,_int> local_98;
  pair<int,_int> local_90;
  pair<int,_int> local_88;
  pair<int,_int> local_80;
  pair<int,_int> local_78;
  pair<int,_int> local_70;
  pair<int,_int> local_68;
  shared_ptr<Population> local_60 [2];
  string local_40 [32];
  string *local_20;
  string *name_local;
  PopulationDirector *this_local;
  type *oldPtr;
  
  local_20 = in_RDX;
  name_local = name;
  this_local = this;
  peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  std::__cxx11::string::string(local_40,local_20);
  (*peVar3->_vptr_PopulationBuilder[1])(peVar3,local_40);
  std::__cxx11::string::~string(local_40);
  peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  (**peVar3->_vptr_PopulationBuilder)();
  peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  (*peVar3->_vptr_PopulationBuilder[0xb])();
  this_00 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_60);
  TVar1 = Population::GetType(this_00);
  std::shared_ptr<Population>::~shared_ptr(local_60);
  if (TVar1 == HERBIVORE) {
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_68 = Config::getHerbivoreAverageAnimalAmount(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_68);
    (*peVar3->_vptr_PopulationBuilder[2])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_70 = Config::getHerbivoreAverageHealth(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_70);
    (*peVar3->_vptr_PopulationBuilder[3])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_78 = Config::getHerbivoreAverageProductivity(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_78);
    (*peVar3->_vptr_PopulationBuilder[4])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_80 = Config::getHerbivoreAverageBiologyDev(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_80);
    (*peVar3->_vptr_PopulationBuilder[5])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[6])(peVar3,2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[7])(peVar3,2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[8])(peVar3,2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[9])(peVar3,2);
  }
  else {
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_88 = Config::getCarnivoreAverageAnimalAmount(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_88);
    (*peVar3->_vptr_PopulationBuilder[2])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_90 = Config::getCarnivoreAverageHealth(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_90);
    (*peVar3->_vptr_PopulationBuilder[3])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_98 = Config::getCarnivoreAverageProductivity(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_98);
    (*peVar3->_vptr_PopulationBuilder[4])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    local_a0 = Config::getCarnivoreAverageBiologyDev(pCVar5);
    uVar2 = RandomGenerator::randNormalInt(pRVar4,local_a0);
    (*peVar3->_vptr_PopulationBuilder[5])(peVar3,(ulong)uVar2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[6])(peVar3,2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[7])(peVar3,2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[8])(peVar3,2);
    peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
    (*peVar3->_vptr_PopulationBuilder[9])(peVar3,2);
  }
  local_a1 = 0;
  peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  (*peVar3->_vptr_PopulationBuilder[0xb])();
  std::shared_ptr<Population>::shared_ptr((shared_ptr<Population> *)this,&local_b8);
  std::shared_ptr<Population>::~shared_ptr(&local_b8);
  peVar3 = std::__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  (*peVar3->_vptr_PopulationBuilder[10])();
  sVar6.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Population>)sVar6.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Population> PopulationDirector::makeAverage(const std::string &name) {
  builder->setName(name);
  builder->setType();
  if (builder->getProduct()->GetType() == Population::TypeName::HERBIVORE) {
    builder->setAmount(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageAnimalAmount()));
    builder->setHealth(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageHealth()));
    builder->setProductivity(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageProductivity()));
    builder->setBiologyDev(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageBiologyDev()));
    builder->setSize(Population::AVERAGE);
    builder->setSafety(Population::AVERAGE);
    builder->setVelocity(Population::AVERAGE);
    builder->setCover(Population::AVERAGE);
  } else {
    builder->setAmount(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageAnimalAmount()));
    builder->setHealth(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageHealth()));
    builder->setProductivity(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageProductivity()));
    builder->setBiologyDev(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageBiologyDev()));
    builder->setSize(Population::AVERAGE);
    builder->setSafety(Population::AVERAGE);
    builder->setVelocity(Population::AVERAGE);
    builder->setCover(Population::AVERAGE);
  }
  auto oldPtr = std::move(builder -> getProduct());
  builder -> resetPopulation();

  return oldPtr;
}